

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O3

Dec_Edge_t Dec_FactorTrivialTree_rec(Dec_Graph_t *pFForm,Dec_Edge_t *peNodes,int nNodes,int fNodeOr)

{
  int iVar1;
  size_t sVar2;
  Dec_Edge_t DVar3;
  Dec_Edge_t DVar4;
  Dec_Node_t *__ptr;
  int iVar5;
  
  if (nNodes == 1) {
    DVar3 = *peNodes;
  }
  else {
    iVar5 = nNodes / 2;
    DVar3 = Dec_FactorTrivialTree_rec(pFForm,peNodes,iVar5,fNodeOr);
    DVar4 = Dec_FactorTrivialTree_rec(pFForm,peNodes + iVar5,nNodes - iVar5,fNodeOr);
    iVar5 = pFForm->nSize;
    __ptr = pFForm->pNodes;
    if (fNodeOr == 0) {
      if (iVar5 == pFForm->nCap) {
        sVar2 = (long)iVar5 * 0x30;
        if (__ptr == (Dec_Node_t *)0x0) {
          __ptr = (Dec_Node_t *)malloc(sVar2);
          iVar1 = iVar5;
        }
        else {
          __ptr = (Dec_Node_t *)realloc(__ptr,sVar2);
          iVar5 = pFForm->nSize;
          iVar1 = pFForm->nCap;
        }
        pFForm->pNodes = __ptr;
        pFForm->nCap = iVar1 * 2;
      }
      pFForm->nSize = iVar5 + 1;
      __ptr[iVar5].field_2.pFunc = (void *)0x0;
      (&__ptr[iVar5].field_2)[1].pFunc = (void *)0x0;
      __ptr[iVar5].eEdge0 = DVar3;
      __ptr[iVar5].eEdge1 = DVar4;
      *(uint *)&__ptr[iVar5].field_0x10 = ((uint)DVar4 & 1) << 0x10 | ((uint)DVar3 & 1) << 0xf;
      DVar3 = (Dec_Edge_t)(pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe);
    }
    else {
      if (iVar5 == pFForm->nCap) {
        sVar2 = (long)iVar5 * 0x30;
        if (__ptr == (Dec_Node_t *)0x0) {
          __ptr = (Dec_Node_t *)malloc(sVar2);
          iVar1 = iVar5;
        }
        else {
          __ptr = (Dec_Node_t *)realloc(__ptr,sVar2);
          iVar5 = pFForm->nSize;
          iVar1 = pFForm->nCap;
        }
        pFForm->pNodes = __ptr;
        pFForm->nCap = iVar1 * 2;
      }
      pFForm->nSize = iVar5 + 1;
      __ptr[iVar5].field_2.pFunc = (void *)0x0;
      (&__ptr[iVar5].field_2)[1].pFunc = (void *)0x0;
      *(uint *)&__ptr[iVar5].field_0x10 =
           ((uint)DVar3 & 1) * 0x8000 + ((uint)DVar4 & 1) * 0x10000 + 0x4000;
      __ptr[iVar5].eEdge0 = (Dec_Edge_t)((uint)DVar3 ^ 1);
      __ptr[iVar5].eEdge1 = (Dec_Edge_t)((uint)DVar4 ^ 1);
      DVar3 = (Dec_Edge_t)((pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
    }
  }
  return DVar3;
}

Assistant:

Dec_Edge_t Dec_FactorTrivialTree_rec( Dec_Graph_t * pFForm, Dec_Edge_t * peNodes, int nNodes, int fNodeOr )
{
    Dec_Edge_t eNode1, eNode2;
    int nNodes1, nNodes2;

    if ( nNodes == 1 )
        return peNodes[0];

    // split the nodes into two parts
    nNodes1 = nNodes/2;
    nNodes2 = nNodes - nNodes1;
//    nNodes2 = nNodes/2;
//    nNodes1 = nNodes - nNodes2;

    // recursively construct the tree for the parts
    eNode1 = Dec_FactorTrivialTree_rec( pFForm, peNodes,           nNodes1, fNodeOr );
    eNode2 = Dec_FactorTrivialTree_rec( pFForm, peNodes + nNodes1, nNodes2, fNodeOr );

    if ( fNodeOr )
        return Dec_GraphAddNodeOr( pFForm, eNode1, eNode2 );
    else
        return Dec_GraphAddNodeAnd( pFForm, eNode1, eNode2 );
}